

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort.h
# Opt level: O2

void Minisat::sort<long,Minisat::LessThan_default<long>>(long *array,ulong param_2)

{
  ulong uVar1;
  int iVar2;
  long *plVar3;
  ulong uVar4;
  bool bVar5;
  uint uVar6;
  long *__dest;
  uint uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long *plVar15;
  ulong uVar16;
  
  param_2 = param_2 & 0xffffffff;
  while( true ) {
    uVar7 = (uint)param_2;
    if ((int)uVar7 < 0x10) {
      selectionSort<long,Minisat::LessThan_default<long>>(array,param_2);
      return;
    }
    if (0x20 < uVar7) break;
    lVar9 = array[param_2 >> 1];
    uVar16 = 0xffffffffffffffff;
    while( true ) {
      uVar16 = (ulong)(int)uVar16;
      plVar3 = array + uVar16;
      do {
        uVar16 = uVar16 + 1;
        lVar14 = plVar3[1];
        plVar3 = plVar3 + 1;
      } while (lVar14 < lVar9);
      param_2 = (ulong)(int)param_2;
      do {
        lVar10 = param_2 - 1;
        param_2 = param_2 - 1;
      } while (lVar9 < array[lVar10]);
      if ((long)param_2 <= (long)uVar16) break;
      *plVar3 = array[lVar10];
      array[param_2] = lVar14;
    }
    sort<long,Minisat::LessThan_default<long>>(array,uVar16 & 0xffffffff);
    param_2 = (ulong)(uVar7 - (int)uVar16);
    array = plVar3;
  }
  plVar3 = (long *)operator_new__(param_2 * 8);
  bVar5 = false;
  uVar16 = 0;
  iVar8 = 1;
  while (__dest = plVar3, iVar8 < (int)uVar7) {
    iVar2 = iVar8 * 2;
    plVar3 = __dest;
    for (uVar4 = 0; uVar1 = uVar4 + (long)iVar8, (long)uVar1 < (long)param_2;
        uVar4 = uVar4 + (long)iVar2) {
      uVar6 = iVar8 + (int)uVar1;
      if ((int)uVar7 <= (int)uVar6) {
        uVar6 = uVar7;
      }
      uVar13 = uVar4 & 0xffffffff;
      uVar12 = uVar1 & 0xffffffff;
      uVar16 = uVar4;
      plVar15 = plVar3;
      while( true ) {
        lVar14 = (long)(int)uVar13;
        iVar11 = (int)uVar12;
        lVar9 = (long)iVar11;
        if (((long)uVar1 <= lVar14) || ((int)uVar6 <= iVar11)) break;
        lVar9 = array[lVar14];
        lVar14 = array[iVar11];
        lVar10 = lVar14;
        if (lVar9 < lVar14) {
          lVar10 = lVar9;
        }
        uVar13 = (ulong)((int)uVar13 + (uint)(lVar9 < lVar14));
        uVar12 = (ulong)(iVar11 + (uint)(lVar14 <= lVar9));
        __dest[uVar16] = lVar10;
        uVar16 = uVar16 + 1;
        plVar15 = plVar15 + 1;
      }
      for (; lVar14 < (long)uVar1; lVar14 = lVar14 + 1) {
        __dest[uVar16] = array[lVar14];
        uVar16 = uVar16 + 1;
        plVar15 = plVar15 + 1;
      }
      for (; lVar9 < (int)uVar6; lVar9 = lVar9 + 1) {
        uVar16 = uVar16 + 1;
        *plVar15 = array[lVar9];
        plVar15 = plVar15 + 1;
      }
      plVar3 = plVar3 + iVar2;
    }
    for (uVar16 = (ulong)(int)uVar16; (long)uVar16 < (long)param_2; uVar16 = uVar16 + 1) {
      __dest[uVar16] = array[uVar16];
    }
    bVar5 = (bool)(bVar5 ^ 1);
    plVar3 = array;
    array = __dest;
    iVar8 = iVar2;
  }
  if (bVar5) {
    memcpy(__dest,array,param_2 * 8);
    __dest = array;
  }
  if (__dest == (long *)0x0) {
    return;
  }
  operator_delete__(__dest);
  return;
}

Assistant:

void sort(T *array, int size, LessThan lt)
{
    if (size <= 15) {
        selectionSort(array, size, lt);
    } else if (size > 32) {
        mergesort(array, size, lt);
    } else {
        T pivot = array[size / 2];
        T tmp;
        int i = -1;
        int j = size;

        for (;;) {
            do
                i++;
            while (lt(array[i], pivot));
            do
                j--;
            while (lt(pivot, array[j]));

            if (i >= j) break;

            tmp = array[i];
            array[i] = array[j];
            array[j] = tmp;
        }

        sort(array, i, lt);
        sort(&array[i], size - i, lt);
    }
}